

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O3

bool ChangePortalLine(line_t *line,int destid)

{
  FLinePortal *port;
  FLinePortal *port_00;
  uint uVar1;
  byte bVar2;
  line_t *plVar3;
  FLinePortal *pFVar4;
  
  uVar1 = line->portalindex;
  if ((linePortals.Count <= uVar1) || (linePortals.Array[uVar1].mType == '\x03')) {
    return false;
  }
  port = linePortals.Array + uVar1;
  if (destid == 0) {
    port->mDestination = (line_t *)0x0;
  }
  else {
    plVar3 = FindDestination(line,destid);
    port->mDestination = plVar3;
    if (plVar3 != (line_t *)0x0) {
      if (port->mType == '\x02') {
        port_00 = linePortals.Array + plVar3->portalindex;
        bVar2 = port->mDefFlags;
        pFVar4 = port;
        if ((port_00->mType == '\x02') &&
           (linePortals.Array[plVar3->portalindex].mDestination == line)) {
          port->mFlags = bVar2 | 8;
          bVar2 = port_00->mDefFlags | 8;
          pFVar4 = port_00;
        }
        pFVar4->mFlags = bVar2;
        SetRotation(port_00);
      }
      goto LAB_0058ed46;
    }
  }
  port->mFlags = '\0';
LAB_0058ed46:
  SetRotation(port);
  return true;
}

Assistant:

static bool ChangePortalLine(line_t *line, int destid)
{
	if (line->portalindex >= linePortals.Size()) return false;
	FLinePortal *port = &linePortals[line->portalindex];
	if (port->mType == PORTT_LINKED) return false;	// linked portals cannot be changed.
	if (destid == 0) port->mDestination = NULL;
	port->mDestination = FindDestination(line, destid);
	if (port->mDestination == NULL)
	{
		port->mFlags = 0;
	}
	else if (port->mType == PORTT_INTERACTIVE)
	{
		FLinePortal *portd = &linePortals[port->mDestination->portalindex];
		if (portd != NULL && portd->mType == PORTT_INTERACTIVE && portd->mDestination == line)
		{
			// this is a 2-way interactive portal
			port->mFlags = port->mDefFlags | PORTF_INTERACTIVE;
			portd->mFlags = portd->mDefFlags | PORTF_INTERACTIVE;
		}
		else
		{
			port->mFlags = port->mDefFlags;
		}
		SetRotation(portd);
	}
	SetRotation(port);
	return true;
}